

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasdreamOptimizationTests.cpp
# Opt level: O2

bool TasOptimization::testParticleSwarmState(bool verbose)

{
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  double *pdVar10;
  long lVar11;
  ulong uVar12;
  byte bVar13;
  bool bVar14;
  bool bVar15;
  double dVar16;
  initializer_list<TasOptimization::ParticleSwarmState> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  reference rVar17;
  reference rVar18;
  allocator_type local_361;
  undefined1 local_360 [40];
  vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
  states;
  vector<bool,_std::allocator<bool>_> init_vector;
  vector<double,_std::allocator<double>_> ones2;
  vector<double,_std::allocator<double>_> ones1;
  vector<double,_std::allocator<double>_> upper;
  vector<double,_std::allocator<double>_> lower;
  vector<double,_std::allocator<double>_> velocities;
  vector<double,_std::allocator<double>_> positions;
  vector<double,_std::allocator<double>_> dummy_velocities;
  vector<double,_std::allocator<double>_> dummy_positions;
  minstd_rand park_miller;
  _Any_data local_218;
  code *local_208;
  code *local_200;
  ParticleSwarmState state;
  ParticleSwarmState local_120;
  undefined8 local_48;
  undefined8 uStack_40;
  
  std::vector<double,_std::allocator<double>_>::vector
            (&dummy_positions,0x1e,(allocator_type *)&state);
  std::vector<double,_std::allocator<double>_>::vector
            (&dummy_velocities,0x1e,(allocator_type *)&state);
  TasOptimization::ParticleSwarmState::ParticleSwarmState(&state,2,0xf);
  TasOptimization::ParticleSwarmState::ParticleSwarmState
            (&local_120,2,(vector *)&dummy_positions,(vector *)&dummy_velocities);
  __l._M_len = 2;
  __l._M_array = &state;
  std::
  vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
  ::vector(&states,__l,(allocator_type *)&init_vector);
  lVar11 = 0xd8;
  do {
    ParticleSwarmState::~ParticleSwarmState
              ((ParticleSwarmState *)(&state.positions_initialized + lVar11));
    lVar11 = lVar11 + -0xd8;
  } while (lVar11 != -0xd8);
  bVar13 = 1;
  for (lVar11 = 0; lVar11 != 0x1b0; lVar11 = lVar11 + 0xd8) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&state,
               (vector<double,_std::allocator<double>_> *)
               ((long)&((states.
                         super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                         ._M_impl.super__Vector_impl_data._M_start)->particle_positions).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar11));
    uVar6 = state._8_8_;
    uVar3 = state._0_8_;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&state);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&state,
               (vector<double,_std::allocator<double>_> *)
               ((long)&((states.
                         super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                         ._M_impl.super__Vector_impl_data._M_start)->particle_velocities).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar11));
    uVar7 = state._8_8_;
    uVar4 = state._0_8_;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&state);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&state,
               (vector<double,_std::allocator<double>_> *)
               ((long)&((states.
                         super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                         ._M_impl.super__Vector_impl_data._M_start)->best_particle_positions).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar11));
    uVar8 = state._8_8_;
    uVar5 = state._0_8_;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&state);
    ParticleSwarmState::getBestPosition
              ((vector<double,_std::allocator<double>_> *)&state,
               (ParticleSwarmState *)
               (&(states.
                  super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                  ._M_impl.super__Vector_impl_data._M_start)->positions_initialized + lVar11));
    lVar9 = state._8_8_ - state._0_8_;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&state);
    ParticleSwarmState::getStateVector
              ((vector<bool,_std::allocator<bool>_> *)&state,
               (ParticleSwarmState *)
               (&(states.
                  super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                  ._M_impl.super__Vector_impl_data._M_start)->positions_initialized + lVar11));
    if (lVar11 == 0) {
      rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)&state,0);
      uVar12 = *rVar17._M_p;
      rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)&state,1);
      bVar14 = (uVar12 & rVar17._M_mask) == 0;
      bVar15 = (*rVar18._M_p & rVar18._M_mask) == 0;
    }
    else {
      rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)&state,0);
      uVar12 = *rVar17._M_p;
      rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)&state,1);
      bVar14 = (uVar12 & rVar17._M_mask) != 0;
      bVar15 = (*rVar18._M_p & rVar18._M_mask) != 0;
    }
    rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)&state,2);
    uVar12 = *rVar17._M_p;
    rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)&state,3);
    bVar13 = (uVar7 - uVar4 == 0xf0 && uVar8 - uVar5 == 0x100) & bVar13 & uVar6 - uVar3 == 0xf0 &
             lVar9 == 0x10 & bVar14 &
             (*rVar18._M_p & rVar18._M_mask) == 0 & bVar15 & (uVar12 & rVar17._M_mask) == 0;
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              ((_Bvector_base<std::allocator<bool>_> *)&state);
  }
  state.positions_initialized = false;
  state.velocities_initialized = false;
  state.best_positions_initialized = false;
  state.cache_initialized = false;
  state.num_dimensions = -0x40100000;
  state.num_particles = 0;
  state._12_4_ = 0x3ff00000;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&state;
  std::vector<double,_std::allocator<double>_>::vector(&lower,__l_00,(allocator_type *)&init_vector)
  ;
  state.positions_initialized = false;
  state.velocities_initialized = false;
  state.best_positions_initialized = false;
  state.cache_initialized = false;
  state.num_dimensions = 0x40000000;
  state.num_particles = 0;
  state._12_4_ = 0x40080000;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&state;
  std::vector<double,_std::allocator<double>_>::vector(&upper,__l_01,(allocator_type *)&init_vector)
  ;
  local_218._8_8_ = &park_miller;
  park_miller._M_x = 0x2a;
  local_218._M_unused._M_object = &local_48;
  local_48 = 0;
  uStack_40 = 0x3ff0000000000000;
  local_200 = std::
              _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/tasdreamOptimizationTests.cpp:86:21)>
              ::_M_invoke;
  local_208 = std::
              _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/tasdreamOptimizationTests.cpp:86:21)>
              ::_M_manager;
  TasOptimization::ParticleSwarmState::initializeParticlesInsideBox
            (states.
             super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
             ._M_impl.super__Vector_impl_data._M_start,&lower,&upper);
  std::_Function_base::~_Function_base((_Function_base *)&local_218);
  std::vector<double,_std::allocator<double>_>::vector
            (&positions,
             &(states.
               super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
               ._M_impl.super__Vector_impl_data._M_start)->particle_positions);
  std::vector<double,_std::allocator<double>_>::vector
            (&velocities,
             &(states.
               super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
               ._M_impl.super__Vector_impl_data._M_start)->particle_velocities);
  for (lVar11 = 0; lVar11 != 0x1e; lVar11 = lVar11 + 1) {
    uVar12 = (ulong)(((uint)lVar11 & 1) << 3);
    dVar1 = *(double *)
             ((long)lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar12);
    dVar2 = *(double *)
             ((long)upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar12);
    dVar16 = ABS(dVar2 - dVar1);
    bVar13 = -(velocities.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11] <= dVar16 + 1e-12) &
             -(-1e-12 - dVar16 <=
              velocities.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar11]) &
             positions.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar11] <= dVar2 + 1e-12 &
             bVar13 & dVar1 + -1e-12 <=
                      positions.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar11];
  }
  ParticleSwarmState::getStateVector
            (&init_vector,
             states.
             super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
             ._M_impl.super__Vector_impl_data._M_start);
  rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](&init_vector,0);
  if ((*rVar17._M_p & rVar17._M_mask) == 0) {
    bVar14 = false;
  }
  else {
    rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](&init_vector,1);
    bVar14 = (*rVar17._M_p & rVar17._M_mask) != 0;
  }
  TasOptimization::ParticleSwarmState::ParticleSwarmState(&state,2,0xf);
  local_360._0_8_ = &DAT_3ff0000000000000;
  std::vector<double,_std::allocator<double>_>::vector
            (&ones1,0x1e,(value_type_conflict1 *)local_360,(allocator_type *)&ones2);
  local_360._0_8_ = &DAT_3ff0000000000000;
  std::vector<double,_std::allocator<double>_>::vector
            (&ones2,0x20,(value_type_conflict1 *)local_360,&local_361);
  ParticleSwarmState::setParticlePositions(&state,&ones1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_360,&state.particle_positions);
  bVar13 = bVar13 & bVar14;
  for (pdVar10 = (double *)local_360._0_8_; pdVar10 != (double *)local_360._8_8_;
      pdVar10 = pdVar10 + 1) {
    bVar13 = bVar13 & *pdVar10 == 1.0;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)local_360);
  ParticleSwarmState::setParticleVelocities(&state,&ones1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_360,&state.particle_velocities);
  for (pdVar10 = (double *)local_360._0_8_; pdVar10 != (double *)local_360._8_8_;
      pdVar10 = pdVar10 + 1) {
    bVar13 = bVar13 & *pdVar10 == 1.0;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)local_360);
  ParticleSwarmState::setBestParticlePositions(&state,&ones2);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_360,&state.best_particle_positions);
  for (pdVar10 = (double *)local_360._0_8_; pdVar10 != (double *)local_360._8_8_;
      pdVar10 = pdVar10 + 1) {
    bVar13 = bVar13 & *pdVar10 == 1.0;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)local_360);
  ParticleSwarmState::getStateVector((vector<bool,_std::allocator<bool>_> *)local_360,&state);
  std::vector<bool,_std::allocator<bool>_>::operator=
            (&init_vector,(vector<bool,_std::allocator<bool>_> *)local_360);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)local_360);
  rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](&init_vector,0);
  if ((*rVar17._M_p & rVar17._M_mask) != 0) {
    rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](&init_vector,1);
    if ((*rVar17._M_p & rVar17._M_mask) != 0) {
      rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](&init_vector,2);
      bVar14 = (*rVar17._M_p & rVar17._M_mask) != 0;
      goto LAB_0011457f;
    }
  }
  bVar14 = false;
LAB_0011457f:
  ParticleSwarmState::clearBestParticles(&state);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_360,
             &(states.
               super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
               ._M_impl.super__Vector_impl_data._M_start)->best_particle_positions);
  bVar13 = bVar13 & bVar14;
  for (pdVar10 = (double *)local_360._0_8_; pdVar10 != (double *)local_360._8_8_;
      pdVar10 = pdVar10 + 1) {
    bVar13 = bVar13 & *pdVar10 == 0.0;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)local_360);
  ParticleSwarmState::getStateVector((vector<bool,_std::allocator<bool>_> *)local_360,&state);
  std::vector<bool,_std::allocator<bool>_>::operator=
            (&init_vector,(vector<bool,_std::allocator<bool>_> *)local_360);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)local_360);
  rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](&init_vector,2);
  bVar14 = (bool)(bVar13 & (*rVar17._M_p & rVar17._M_mask) == 0);
  if ((byte)(bVar14 ^ 1U | verbose) == 1) {
    reportPassFail(bVar14,"Particle Swarm","State Unit Tests");
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&ones2.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&ones1.super__Vector_base<double,_std::allocator<double>_>);
  ParticleSwarmState::~ParticleSwarmState(&state);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&init_vector.super__Bvector_base<std::allocator<bool>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&velocities.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&positions.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&upper.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&lower.super__Vector_base<double,_std::allocator<double>_>);
  std::
  vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
  ::~vector(&states);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&dummy_velocities.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&dummy_positions.super__Vector_base<double,_std::allocator<double>_>);
  return bVar14;
}

Assistant:

bool testParticleSwarmState(bool verbose) {
    test_result test;

    // Check size of the accessible vectors generated by different constructors.
    int num_dimensions = 2;
    int num_particles = 15;
    std::vector<double> dummy_positions(num_dimensions * num_particles);
    std::vector<double> dummy_velocities(num_dimensions * num_particles);
    std::vector<ParticleSwarmState> states = {
        ParticleSwarmState(num_dimensions, num_particles),
        ParticleSwarmState(num_dimensions, std::move(dummy_positions), std::move(dummy_velocities))
    };
    for (int i=0; i<2; i++) {
        test.tassert(states[i].getParticlePositions().size() == Utils::size_mult(num_dimensions, num_particles));
        test.tassert(states[i].getParticleVelocities().size() == Utils::size_mult(num_dimensions, num_particles));
        test.tassert(states[i].getBestParticlePositions().size() == Utils::size_mult(num_dimensions, num_particles+1));
        test.tassert(states[i].getBestPosition().size() == (size_t) num_dimensions);
        std::vector<bool> init_vector = states[i].getStateVector();
        test.tassert(i == 0 ? not init_vector[0] : init_vector[0]);
        test.tassert(i == 0 ? not init_vector[1] : init_vector[1]);
        test.tassert(not init_vector[2]);
        test.tassert(not init_vector[3]);
    }

    // Check TasOptimization::ParticleSwarmState::initializeParticlesInsideBox().
    std::vector<double> lower = {-1.0, 1.0};
    std::vector<double> upper = {2.0, 3.0};
    std::minstd_rand park_miller(42);
    std::uniform_real_distribution<double> unif(0.0, 1.0);
    auto get_rand = [&]()->double{ return unif(park_miller); };
    states[0].initializeParticlesInsideBox(lower, upper, get_rand);
    std::vector<double> positions = states[0].getParticlePositions();
    std::vector<double> velocities = states[0].getParticleVelocities();
    for (int i=0; i<num_particles * num_dimensions; i++) {
        test.tassert(positions[i] >= lower[i % num_dimensions] - TasGrid::Maths::num_tol);
        test.tassert(positions[i] <= upper[i % num_dimensions] + TasGrid::Maths::num_tol);
        double range = fabs(upper[i % num_dimensions] - lower[i % num_dimensions]);
        test.tassert(velocities[i] >= -range - TasGrid::Maths::num_tol);
        test.tassert(velocities[i] <=  range + TasGrid::Maths::num_tol);
    }
    std::vector<bool> init_vector = states[0].getStateVector();
    test.tassert(init_vector[0] and init_vector[1]);

    // Check the nontrivial setters.
    ParticleSwarmState state(num_dimensions, num_particles);
    std::vector<double> ones1(num_dimensions * num_particles, 1);
    std::vector<double> ones2(num_dimensions * (num_particles + 1), 1);
    state.setParticlePositions(ones1);
    for (auto p : state.getParticlePositions()) test.tassert(p == 1);
    state.setParticleVelocities(ones1);
    for (auto v : state.getParticleVelocities()) test.tassert(v == 1);
    state.setBestParticlePositions(ones2);
    for (auto bp : state.getBestParticlePositions()) test.tassert(bp == 1);
    init_vector = state.getStateVector();
    test.tassert(init_vector[0] and init_vector[1] and init_vector[2]);

    // Check TasOptimization::ParticleSwarmState::clearBestParticles().
    state.clearBestParticles();
    for (auto bp : states[0].getBestParticlePositions()) test.tassert(bp == 0);
    init_vector = state.getStateVector();
    test.tassert(not init_vector[2]);

    // Reporting.
    if (test.failed_any() or verbose) reportPassFail(test.success(), "Particle Swarm", "State Unit Tests");
    return test.success();
}